

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

saidx64_t sa_simplesearch64(sauchar_t *T,saidx64_t Tsize,saidx64_t *SA,saidx64_t SAsize,saint_t c,
                           saidx64_t *idx)

{
  ulong uVar1;
  saidx64_t sVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  if (idx != (saidx64_t *)0x0) {
    *idx = -1;
  }
  sVar2 = -1;
  if (-1 < (SAsize | Tsize) && (SA != (saidx64_t *)0x0 && T != (sauchar_t *)0x0)) {
    if (SAsize != 0 && Tsize != 0) {
      if (SAsize < 1) {
        sVar2 = 0;
      }
      else {
        uVar4 = (ulong)SAsize >> 1;
        sVar2 = 0;
        do {
          iVar5 = -1;
          if (SA[sVar2 + uVar4] < Tsize) {
            iVar5 = (uint)T[SA[sVar2 + uVar4]] - c;
          }
          if (iVar5 < 0) {
            sVar2 = sVar2 + uVar4 + 1;
            uVar4 = uVar4 - (~(uint)SAsize & 1);
          }
          else if (iVar5 == 0) {
            uVar7 = uVar4;
            lVar6 = sVar2;
            while (uVar1 = uVar7, 0 < (long)uVar1) {
              uVar7 = uVar1 >> 1;
              if ((Tsize <= SA[lVar6 + uVar7]) || ((int)(uint)T[SA[lVar6 + uVar7]] < c)) {
                lVar6 = lVar6 + uVar7 + 1;
                uVar7 = uVar7 - (~(uint)uVar1 & 1);
              }
            }
            lVar3 = sVar2 + uVar4 + 1;
            uVar4 = SAsize + ~uVar4;
            while (uVar7 = uVar4, 0 < (long)uVar7) {
              uVar4 = uVar7 >> 1;
              if ((Tsize <= SA[lVar3 + uVar4]) || ((int)(uint)T[SA[lVar3 + uVar4]] <= c)) {
                lVar3 = lVar3 + uVar4 + 1;
                uVar4 = uVar4 - (~(uint)uVar7 & 1);
              }
            }
            goto LAB_00106e6e;
          }
          SAsize = uVar4;
          uVar4 = SAsize >> 1;
        } while (0 < SAsize);
      }
      lVar6 = 0;
      lVar3 = 0;
LAB_00106e6e:
      if (idx != (saidx64_t *)0x0) {
        if (lVar6 < lVar3) {
          sVar2 = lVar6;
        }
        *idx = sVar2;
      }
      return lVar3 - lVar6;
    }
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

saidx_t
sa_simplesearch(const sauchar_t *T, saidx_t Tsize,
                const saidx_t *SA, saidx_t SAsize,
                saint_t c, saidx_t *idx) {
  saidx_t size, lsize, rsize, half;
  saidx_t i, j, k, p;
  saint_t r;

  if(idx != NULL) { *idx = -1; }
  if((T == NULL) || (SA == NULL) || (Tsize < 0) || (SAsize < 0)) { return -1; }
  if((Tsize == 0) || (SAsize == 0)) { return 0; }

  for(i = j = k = 0, size = SAsize, half = size >> 1;
      0 < size;
      size = half, half >>= 1) {
    p = SA[i + half];
    r = (p < Tsize) ? T[p] - c : -1;
    if(r < 0) {
      i += half + 1;
      half -= (size & 1) ^ 1;
    } else if(r == 0) {
      lsize = half, j = i, rsize = size - half - 1, k = i + half + 1;

      /* left part */
      for(half = lsize >> 1;
          0 < lsize;
          lsize = half, half >>= 1) {
        p = SA[j + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r < 0) {
          j += half + 1;
          half -= (lsize & 1) ^ 1;
        }
      }

      /* right part */
      for(half = rsize >> 1;
          0 < rsize;
          rsize = half, half >>= 1) {
        p = SA[k + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r <= 0) {
          k += half + 1;
          half -= (rsize & 1) ^ 1;
        }
      }

      break;
    }
  }

  if(idx != NULL) { *idx = (0 < (k - j)) ? j : i; }
  return k - j;
}